

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<(anonymous_namespace)::Constructable,_4UL>::shrink_to_fit
          (SmallVector<(anonymous_namespace)::Constructable,_4UL> *this)

{
  char *pcVar1;
  pointer pCVar2;
  EVP_PKEY_CTX *ctx;
  int iVar3;
  EVP_PKEY_CTX *pEVar4;
  pointer newData;
  
  pCVar2 = (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
  pcVar1 = (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).firstElement;
  if (pCVar2 != (pointer)pcVar1) {
    ctx = (EVP_PKEY_CTX *)(this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len;
    if ((EVP_PKEY_CTX *)0x4 < ctx) {
      SmallVectorBase<(anonymous_namespace)::Constructable>::reallocateTo
                (&this->super_SmallVectorBase<(anonymous_namespace)::Constructable>,(size_type)ctx);
      return;
    }
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      ctx = (EVP_PKEY_CTX *)((long)ctx << 3);
      iVar3 = 0;
      pEVar4 = (EVP_PKEY_CTX *)0x0;
      do {
        pcVar1[(long)pEVar4] = '\x01';
        *(undefined4 *)
         ((this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).firstElement + 4 +
         (long)pEVar4) = *(undefined4 *)((long)&pCVar2->value + (long)pEVar4);
        *(undefined4 *)((long)&pCVar2->value + (long)pEVar4) = 0;
        pEVar4 = pEVar4 + 8;
        iVar3 = iVar3 + -1;
      } while (ctx != pEVar4);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls - iVar3;
      (anonymous_namespace)::Constructable::numMoveConstructorCalls =
           (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar3;
    }
    SmallVectorBase<(anonymous_namespace)::Constructable>::cleanup
              (&this->super_SmallVectorBase<(anonymous_namespace)::Constructable>,ctx);
    (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap = 4;
    (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_ = (pointer)pcVar1;
  }
  return;
}

Assistant:

[[nodiscard]] constexpr bool isSmall() const noexcept {
        return (const void*)data_ == (const void*)firstElement;
    }